

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * arena_gen(player *p,wchar_t min_height,wchar_t min_width)

{
  chunk *c_00;
  char *pcVar1;
  loc grid;
  monster *pmVar2;
  loc_conflict lVar3;
  monster_conflict *mon;
  chunk_conflict *c;
  wchar_t min_width_local;
  wchar_t min_height_local;
  player *p_local;
  
  pmVar2 = p->upkeep->health_who;
  c_00 = (chunk *)cave_new(min_height,min_width);
  c_00->depth = (int)p->depth;
  pcVar1 = string_make("arena");
  c_00->name = pcVar1;
  fill_rectangle((chunk_conflict *)c_00,L'\0',L'\0',c_00->height + L'\xffffffff',
                 c_00->width + L'\xffffffff',L'\x01',L'\0');
  draw_rectangle((chunk_conflict *)c_00,L'\0',L'\0',c_00->height + L'\xffffffff',
                 c_00->width + L'\xffffffff',L'\x16',L'\0',true);
  grid = loc(1,c_00->height + L'\xfffffffe');
  player_place((chunk_conflict1 *)c_00,p,grid);
  memcpy(c_00->monsters + pmVar2->midx,pmVar2,0x1a0);
  pmVar2 = c_00->monsters + pmVar2->midx;
  lVar3 = (loc_conflict)loc(c_00->width + L'\xfffffffe',1);
  pmVar2->grid = lVar3;
  square_set_mon(c_00,pmVar2->grid,pmVar2->midx);
  c_00->mon_max = (short)pmVar2->midx + 1;
  c_00->mon_cnt = 1;
  update_mon(pmVar2,c_00,true);
  p->upkeep->health_who = pmVar2;
  pmVar2->held_obj = (object *)0x0;
  monster_group_start(c_00,pmVar2,L'\0');
  return (chunk_conflict *)c_00;
}

Assistant:

struct chunk *arena_gen(struct player *p, int min_height, int min_width) {
	struct chunk *c;
	struct monster *mon = p->upkeep->health_who;

	c = cave_new(min_height, min_width);
	c->depth = p->depth;
	c->name = string_make("arena");

	/* Fill cave area with floors */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1, FEAT_FLOOR,
		SQUARE_NONE);

	/* Bound with perma-rock */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, FEAT_PERM,
		SQUARE_NONE, true);

	/* Place the player */
	player_place(c, p, loc(1, c->height - 2));

	/* Place the monster */
	memcpy(&c->monsters[mon->midx], mon, sizeof(*mon));
	mon = &c->monsters[mon->midx];
	mon->grid = loc(c->width - 2, 1);
	square_set_mon(c, mon->grid, mon->midx);
	c->mon_max = mon->midx + 1;
	c->mon_cnt = 1;
	update_mon(mon, c, true);
	p->upkeep->health_who = mon;

	/* Ignore its held objects */
	mon->held_obj = NULL;

	/* Give it a group */
	monster_group_start(c, mon, 0);

	return c;
}